

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O0

void __thiscall
csv::internals::IBasicCSVParser::IBasicCSVParser
          (IBasicCSVParser *this,CSVFormat *format,ColNamesPtr *col_names)

{
  char cVar1;
  char *ws_chars;
  size_type n_chars;
  WhitespaceMap local_92c;
  ParseFlagMap local_82c;
  ParseFlagMap local_420;
  ColNamesPtr *local_20;
  ColNamesPtr *col_names_local;
  CSVFormat *format_local;
  IBasicCSVParser *this_local;
  
  this->_vptr_IBasicCSVParser = (_func_int **)&PTR__IBasicCSVParser_00136a90;
  local_20 = col_names;
  col_names_local = (ColNamesPtr *)format;
  format_local = (CSVFormat *)this;
  CSVRow::CSVRow(&this->current_row);
  std::shared_ptr<csv::internals::RawCSVData>::shared_ptr(&this->data_ptr,(nullptr_t)0x0);
  std::shared_ptr<csv::internals::ColNames>::shared_ptr(&this->_col_names,local_20);
  this->fields = (CSVFieldList *)0x0;
  this->field_start = -1;
  this->field_length = 0;
  this->_eof = false;
  this->source_size = 0;
  this->quote_escape = false;
  this->field_has_double_quote = false;
  this->data_pos = 0;
  this->unicode_bom_scan = false;
  this->_utf8_bom = false;
  this->_records = (RowCollection *)0x0;
  if (((ulong)col_names_local[3].
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr &
      0x100000000) == 0) {
    cVar1 = CSVFormat::get_delim((CSVFormat *)col_names_local);
    make_parse_flags(&local_82c,cVar1,
                     *(char *)((long)&col_names_local[3].
                                      super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + 5));
    memcpy(&this->_parse_flags,&local_82c,0x400);
  }
  else {
    cVar1 = CSVFormat::get_delim((CSVFormat *)col_names_local);
    make_parse_flags(&local_420,cVar1);
    memcpy(&this->_parse_flags,&local_420,0x400);
  }
  ws_chars = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)
                        &col_names_local[1].
                         super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  n_chars = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)
                       &col_names_local[1].
                        super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
  make_ws_flags(&local_92c,ws_chars,n_chars);
  memcpy(&this->_ws_flags,&local_92c,0x100);
  return;
}

Assistant:

CSV_INLINE IBasicCSVParser::IBasicCSVParser(
            const CSVFormat& format,
            const ColNamesPtr& col_names
        ) : _col_names(col_names) {
            if (format.no_quote) {
                _parse_flags = internals::make_parse_flags(format.get_delim());
            }
            else {
                _parse_flags = internals::make_parse_flags(format.get_delim(), format.quote_char);
            }

            _ws_flags = internals::make_ws_flags(
                format.trim_chars.data(), format.trim_chars.size()
            );
        }